

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary.cc
# Opt level: O0

void __thiscall
ctemplate::TemplateDictionary::SetFormattedValue
          (TemplateDictionary *this,TemplateString variable,char *format,...)

{
  small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
  *psVar1;
  TemplateString key;
  TemplateString key_00;
  TemplateString value;
  TemplateString value_00;
  char in_AL;
  char *pcVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_188 [16];
  undefined8 local_178;
  undefined8 local_170;
  undefined8 local_168;
  undefined8 local_160;
  undefined8 local_158;
  undefined8 local_148;
  undefined8 local_138;
  undefined8 local_128;
  undefined8 local_118;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  TemplateString local_d0;
  char *local_b0;
  size_t local_a8;
  bool local_a0;
  undefined7 uStack_9f;
  TemplateId local_98;
  TemplateString local_90;
  char *local_70;
  size_t local_68;
  bool local_60;
  undefined7 uStack_5f;
  TemplateId local_58;
  int local_4c;
  undefined1 local_48 [4];
  int buflen;
  va_list ap;
  char *scratch;
  char *buffer;
  char *format_local;
  TemplateDictionary *this_local;
  
  if (in_AL != '\0') {
    local_158 = in_XMM0_Qa;
    local_148 = in_XMM1_Qa;
    local_138 = in_XMM2_Qa;
    local_128 = in_XMM3_Qa;
    local_118 = in_XMM4_Qa;
    local_108 = in_XMM5_Qa;
    local_f8 = in_XMM6_Qa;
    local_e8 = in_XMM7_Qa;
  }
  local_178 = in_RDX;
  local_170 = in_RCX;
  local_168 = in_R8;
  local_160 = in_R9;
  buffer = format;
  format_local = (char *)this;
  pcVar2 = UnsafeArena::Alloc(this->arena_,0x400);
  ap[0].overflow_arg_area = local_188;
  ap[0]._0_8_ = &stack0x00000028;
  buflen = 0x30;
  local_48 = (undefined1  [4])0x10;
  local_4c = StringAppendV(pcVar2,&scratch,buffer,(__va_list_tag *)local_48);
  LazilyCreateDict<ctemplate::small_map<std::map<unsigned_long,ctemplate::TemplateString,std::less<unsigned_long>,ctemplate::ArenaAllocator<std::pair<unsigned_long_const,ctemplate::TemplateString>,ctemplate::UnsafeArena>>,4,std::equal_to<unsigned_long>,ctemplate::TemplateDictionary::map_arena_init>>
            (this,&this->variable_dict_);
  if (scratch == pcVar2) {
    pcVar2 = UnsafeArena::Shrink(this->arena_,pcVar2,(long)(local_4c + 1));
    psVar1 = this->variable_dict_;
    local_70 = variable.ptr_;
    local_68 = variable.length_;
    local_60 = variable.is_immutable_;
    uStack_5f = variable._17_7_;
    local_58 = variable.id_;
    TemplateString::TemplateString(&local_90,pcVar2,(long)local_4c);
    key.length_ = local_68;
    key.ptr_ = local_70;
    key.is_immutable_ = local_60;
    key._17_7_ = uStack_5f;
    key.id_ = local_58;
    value.length_ = local_90.length_;
    value.ptr_ = local_90.ptr_;
    value.is_immutable_ = local_90.is_immutable_;
    value._17_7_ = local_90._17_7_;
    value.id_ = local_90.id_;
    HashInsert<ctemplate::small_map<std::map<unsigned_long,ctemplate::TemplateString,std::less<unsigned_long>,ctemplate::ArenaAllocator<std::pair<unsigned_long_const,ctemplate::TemplateString>,ctemplate::UnsafeArena>>,4,std::equal_to<unsigned_long>,ctemplate::TemplateDictionary::map_arena_init>,ctemplate::TemplateString>
              (psVar1,key,value);
  }
  else {
    UnsafeArena::Shrink(this->arena_,pcVar2,0);
    psVar1 = this->variable_dict_;
    local_b0 = variable.ptr_;
    local_a8 = variable.length_;
    local_a0 = variable.is_immutable_;
    uStack_9f = variable._17_7_;
    local_98 = variable.id_;
    Memdup(&local_d0,this,scratch,(long)local_4c);
    key_00.length_ = local_a8;
    key_00.ptr_ = local_b0;
    key_00.is_immutable_ = local_a0;
    key_00._17_7_ = uStack_9f;
    key_00.id_ = local_98;
    value_00.length_ = local_d0.length_;
    value_00.ptr_ = local_d0.ptr_;
    value_00.is_immutable_ = local_d0.is_immutable_;
    value_00._17_7_ = local_d0._17_7_;
    value_00.id_ = local_d0.id_;
    HashInsert<ctemplate::small_map<std::map<unsigned_long,ctemplate::TemplateString,std::less<unsigned_long>,ctemplate::ArenaAllocator<std::pair<unsigned_long_const,ctemplate::TemplateString>,ctemplate::UnsafeArena>>,4,std::equal_to<unsigned_long>,ctemplate::TemplateDictionary::map_arena_init>,ctemplate::TemplateString>
              (psVar1,key_00,value_00);
    if (scratch != (char *)0x0) {
      operator_delete__(scratch);
    }
  }
  return;
}

Assistant:

void TemplateDictionary::SetFormattedValue(const TemplateString variable,
                                           const char* format, ...) {
  char* buffer;

  char* scratch = arena_->Alloc(1024);  // StringAppendV requires >=1024 bytes
  va_list ap;
  va_start(ap, format);
  const int buflen = StringAppendV(scratch, &buffer, format, ap);
  va_end(ap);

  LazilyCreateDict(&variable_dict_);

  // If it fit into scratch, great, otherwise we need to copy into arena
  if (buffer == scratch) {
    scratch = arena_->Shrink(scratch, buflen+1);   // from 1024 to |value+\0|
    HashInsert(variable_dict_, variable, TemplateString(scratch, buflen));
  } else {
    arena_->Shrink(scratch, 0);   // reclaim arena space we didn't use
    HashInsert(variable_dict_, variable, Memdup(buffer, buflen));
    delete[] buffer;
  }
}